

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O1

void lj_cdata_free(global_State *g,GCcdata *cd)

{
  size_t *psVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  
  if ((cd->marked & 0x10) == 0) {
    if ((char)cd->marked < '\0') {
      lj_cdata_free_cold_2();
    }
    else {
      lVar2 = *(long *)(ulong)(g->ctype_state).ptr32;
      lVar4 = (ulong)cd->ctypeid * 0x10;
      sVar3 = 0x10;
      if (*(uint *)(lVar2 + lVar4) < 0x60000000) {
        sVar3 = (ulong)*(uint *)(lVar2 + lVar4 + 4) + 8;
      }
      (g->gc).total = (g->gc).total - (int)sVar3;
      psVar1 = &(g->gc).freed;
      *psVar1 = *psVar1 + sVar3;
      (*g->allocf)(g->allocd,cd,sVar3,0);
      psVar1 = &(g->gc).cdatanum;
      *psVar1 = *psVar1 - 1;
    }
  }
  else {
    lj_cdata_free_cold_1();
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_cdata_free(global_State *g, GCcdata *cd)
{
  if (LJ_UNLIKELY(cd->marked & LJ_GC_CDATA_FIN)) {
    GCobj *root;
    makewhite(g, obj2gco(cd));
    markfinalized(obj2gco(cd));
    if ((root = gcref(g->gc.mmudata)) != NULL) {
      setgcrefr(cd->nextgc, root->gch.nextgc);
      setgcref(root->gch.nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    } else {
      setgcref(cd->nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    }
  } else if (LJ_LIKELY(!cdataisv(cd))) {
    CType *ct = ctype_raw(ctype_ctsG(g), cd->ctypeid);
    CTSize sz = ctype_hassize(ct->info) ? ct->size : CTSIZE_PTR;
    lj_assertG(ctype_hassize(ct->info) || ctype_isfunc(ct->info) ||
	       ctype_isextern(ct->info), "free of ctype without a size");
    lj_mem_free(g, cd, sizeof(GCcdata) + sz);
    g->gc.cdatanum--;
  } else {
    lj_mem_free(g, memcdatav(cd), sizecdatav(cd));
    g->gc.cdatanum--;
  }
}